

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

string * __thiscall
wabt::(anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view module_name)

{
  string local_40;
  CWriter *local_20;
  string_view module_name_local;
  
  module_name_local._M_len = module_name._M_len;
  local_20 = this;
  module_name_local._M_str = (char *)__return_storage_ptr__;
  MangleModuleName_abi_cxx11_(&local_40,this,module_name);
  std::operator+(__return_storage_ptr__,"w2c_",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::ModuleInstanceTypeName(std::string_view module_name) {
  return kGlobalSymbolPrefix + MangleModuleName(module_name);
}